

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_four(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
            *this)

{
  bool bVar1;
  reference pvVar2;
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  *in_RDI;
  pair<bool,_unsigned_long> pVar3;
  Index col;
  Index start_row;
  IndexPair idx;
  size_t in_stack_ffffffffffffff78;
  pointer *in_stack_ffffffffffffff80;
  pointer this_00;
  reference in_stack_ffffffffffffff98;
  reference local_58;
  Index local_48;
  undefined1 local_40;
  size_type in_stack_ffffffffffffffc8;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *this_01;
  IndexPair local_30;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *pDStack_28;
  
  IndexPair::IndexPair((IndexPair *)&stack0xffffffffffffffe8);
  while( true ) {
    local_30 = find_zero(this_01,in_stack_ffffffffffffffc8);
    if ((this_01 ==
         (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
          *)0xffffffffffffffff) ||
       (pDStack_28 == (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0xffffffffffffffff
       )) break;
    this_00 = (in_RDI->
              super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage;
    pVar3 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                      (pDStack_28,(size_t)this_01,(long)this_01 + 1);
    in_stack_ffffffffffffffc8 = pVar3.second;
    local_40 = pVar3.first;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)this_00,in_stack_ffffffffffffffc8);
    *pvVar2 = 2;
    bVar1 = has_star_in_row((Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff98._M_p,(Index)in_RDI);
    if (!bVar1) {
      std::
      vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
      ::clear((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
               *)0x1cfc15);
      std::
      vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
      ::emplace_back<unsigned_long&,unsigned_long&>
                (in_RDI,&this_00->row,(unsigned_long *)in_stack_ffffffffffffff80);
      *(undefined4 *)
       &in_RDI[7].
        super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = 4;
      return;
    }
    local_48 = find_star_in_row((Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                                 *)in_stack_ffffffffffffff98._M_p,(Index)in_RDI);
    local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff98._M_mask,
                          (size_type)in_stack_ffffffffffffff98._M_p);
    std::_Bit_reference::operator=(&local_58,true);
    in_stack_ffffffffffffff80 =
         &in_RDI[4].
          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    col_of_idx((Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff98 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff98._M_mask,
                    (size_type)in_stack_ffffffffffffff98._M_p);
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff98,false);
  }
  *(undefined4 *)
   &in_RDI[7].
    super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 5;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_four()
{
    IndexPair idx;
    Index start_row{ 0 };
    while (true) {

        idx = find_zero(start_row);

        if (idx.row == IDXMAX || idx.col == IDXMAX) {
            // No zero found.
            step_ = Step::SIX;
            return;
        }

        // it is more likely to find another zero
        // _after_ the last location, so we pass it
        // as a hint to find_zero.
        start_row = idx.row + 1;

        // prime at given index.
        mask_[graph_.findEdge(idx.row, idx.col).second] = PRIMED;

        if (has_star_in_row(idx.row)) {
            const auto col = find_star_in_row(idx.row);
            row_cover[idx.row] = true;
            col_cover[col_of_idx(col)] = false;
        } else {
            // starting point for augmenting path.
            path_.clear();
            path_.emplace_back(idx.row, idx.col);
            step_ = Step::FIVE;
            return;
        }
    }
}